

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t VELOCYPACK_XXH64_digest(XXH64_state_t *state)

{
  xxh_u64 xVar1;
  ulong *in_RDI;
  xxh_u64 v4;
  xxh_u64 v3;
  xxh_u64 v2;
  xxh_u64 v1;
  xxh_u64 h64;
  XXH_alignment in_stack_00000094;
  size_t in_stack_00000098;
  xxh_u8 *in_stack_000000a0;
  xxh_u64 in_stack_000000a8;
  xxh_u64 in_stack_ffffffffffffffc8;
  
  if (0x1f < *in_RDI) {
    xVar1 = in_RDI[4];
    XXH64_mergeRound(xVar1,in_stack_ffffffffffffffc8);
    XXH64_mergeRound(xVar1,in_stack_ffffffffffffffc8);
    XXH64_mergeRound(xVar1,in_stack_ffffffffffffffc8);
    XXH64_mergeRound(xVar1,in_stack_ffffffffffffffc8);
  }
  xVar1 = XXH64_finalize(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH64_digest(const XXH64_state_t* state) {
  xxh_u64 h64;

  if (state->total_len >= 32) {
    xxh_u64 const v1 = state->v1;
    xxh_u64 const v2 = state->v2;
    xxh_u64 const v3 = state->v3;
    xxh_u64 const v4 = state->v4;

    h64 = XXH_rotl64(v1, 1) + XXH_rotl64(v2, 7) + XXH_rotl64(v3, 12) +
          XXH_rotl64(v4, 18);
    h64 = XXH64_mergeRound(h64, v1);
    h64 = XXH64_mergeRound(h64, v2);
    h64 = XXH64_mergeRound(h64, v3);
    h64 = XXH64_mergeRound(h64, v4);
  } else {
    h64 = state->v3 /*seed*/ + XXH_PRIME64_5;
  }

  h64 += (xxh_u64)state->total_len;

  return XXH64_finalize(h64, (const xxh_u8*)state->mem64,
                        (size_t)state->total_len, XXH_aligned);
}